

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_null_as_integer(void)

{
  error_code eVar1;
  int local_d8 [2];
  error_category *local_d0;
  undefined4 local_c4;
  type_conflict5 local_c0 [2];
  undefined1 local_b8 [8];
  error_code error_1;
  variable data_1;
  undefined4 local_54;
  type_conflict4 local_50 [2];
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  std::error_code::error_code((error_code *)local_48);
  local_50[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                          ((basic_variable<std::allocator<char>_> *)&error._M_cat,
                           (error_code *)local_48);
  local_54 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("data.value<signed int>(error)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x147e,"void value_suite::fail_null_as_integer()",local_50,&local_54);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  data_1.storage._40_4_ = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x147f,"void value_suite::fail_null_as_integer()",local_48,&data_1.storage.field_0x28)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  std::error_code::error_code((error_code *)local_b8);
  local_c0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                          ((basic_variable<std::allocator<char>_> *)&error_1._M_cat,
                           (error_code *)local_b8);
  local_c4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>(error)","0U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1484,"void value_suite::fail_null_as_integer()",local_c0,&local_c4);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  local_d0 = eVar1._M_cat;
  local_d8[0] = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1485,"void value_suite::fail_null_as_integer()",local_b8,local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  return;
}

Assistant:

void fail_null_as_integer()
{
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<signed int>(error), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(error), 0U);
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
}